

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

unique_ptr<pstore::broker::broker_command,_std::default_delete<pstore::broker::broker_command>_>
__thiscall pstore::broker::parse(broker *this,message_type *msg,partial_cmds *cmds)

{
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  long *plVar2;
  pointer pcVar3;
  long lVar4;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __p;
  bool bVar5;
  undefined8 uVar6;
  _Node_iterator_base<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>,_true>
  __it;
  long *plVar7;
  iterator iVar8;
  iterator iVar9;
  part_number_too_large *this_01;
  number_of_parts_mismatch *this_02;
  long lVar10;
  long lVar11;
  long *plVar12;
  long lVar13;
  long lVar14;
  iterator this_03;
  iterator last;
  pair<std::__detail::_Node_iterator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>,_false,_true>,_bool>
  pVar15;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  payload;
  string complete_command;
  undefined1 local_90 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_80;
  string local_70;
  range local_50;
  range verb_parts;
  
  if (msg->num_parts <= msg->part_no) {
    this_01 = (part_number_too_large *)__cxa_allocate_exception(0x10);
    part_number_too_large::part_number_too_large(this_01);
    __cxa_throw(this_01,&part_number_too_large::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar6 = std::chrono::_V2::system_clock::now();
  complete_command._M_dataplus._M_p = (msg->payload)._M_elems;
  lVar11 = 0x100;
  lVar10 = 0xff;
  lVar13 = -0xfe;
  lVar14 = -0x101;
  do {
    local_90._0_8_ = complete_command._M_dataplus._M_p;
    if (lVar14 == -0xd) goto LAB_0011a74c;
    if ((msg->payload)._M_elems[lVar10 + -0xc] != '\0') {
      local_90._0_8_ = (payload_type *)((msg->payload)._M_elems + lVar11 + -0xc);
      goto LAB_0011a74c;
    }
    if ((msg->payload)._M_elems[lVar10 + -0xd] != '\0') {
      local_90._0_8_ = (payload_type *)((msg->payload)._M_elems + lVar10 + -0xc);
      goto LAB_0011a74c;
    }
    if ((msg->payload)._M_elems[lVar10 + -0xe] != '\0') {
      local_90._0_8_ = (payload_type *)((long)msg - lVar13);
      goto LAB_0011a74c;
    }
    lVar11 = lVar11 + -4;
    lVar13 = lVar13 + 4;
    lVar14 = lVar14 + 4;
    lVar4 = lVar10 + -0xf;
    lVar10 = lVar10 + -4;
  } while ((msg->payload)._M_elems[lVar4] == '\0');
  local_90._0_8_ = (payload_type *)((long)msg - lVar14);
LAB_0011a74c:
  std::make_unique<std::__cxx11::string,char_const*,char_const*>
            ((char **)&payload,(char **)&complete_command);
  complete_command._M_dataplus._M_p = (pointer)(ulong)msg->sender_id;
  pcVar3 = *(pointer *)msg;
  complete_command._M_string_length = (size_type)msg->message_id;
  __it._M_cur = (__node_type *)
                std::
                _Hashtable<std::pair<unsigned_long,_unsigned_long>,_std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_long,_unsigned_long>_>,_std::hash<std::pair<unsigned_long,_unsigned_long>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&cmds->_M_h,(key_type *)&complete_command);
  if (__it._M_cur == (__node_type *)0x0) {
    local_90._0_8_ = (payload_type *)0x0;
    complete_command._M_string_length = 0;
    complete_command.field_2._M_allocated_capacity = 0;
    complete_command.field_2._8_8_ = 0;
    local_90._8_8_ = 0;
    aStack_80._M_allocated_capacity = 0;
    aStack_80._8_8_ = 0;
    complete_command._M_dataplus._M_p = pcVar3;
    pVar15 = std::
             _Hashtable<std::pair<unsigned_long,unsigned_long>,std::pair<std::pair<unsigned_long,unsigned_long>const,pstore::broker::pieces>,std::allocator<std::pair<std::pair<unsigned_long,unsigned_long>const,pstore::broker::pieces>>,std::__detail::_Select1st,std::equal_to<std::pair<unsigned_long,unsigned_long>>,std::hash<std::pair<unsigned_long,unsigned_long>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
             ::_M_emplace<std::pair<std::pair<unsigned_int,unsigned_int>,pstore::broker::pieces>>
                       ((_Hashtable<std::pair<unsigned_long,unsigned_long>,std::pair<std::pair<unsigned_long,unsigned_long>const,pstore::broker::pieces>,std::allocator<std::pair<std::pair<unsigned_long,unsigned_long>const,pstore::broker::pieces>>,std::__detail::_Select1st,std::equal_to<std::pair<unsigned_long,unsigned_long>>,std::hash<std::pair<unsigned_long,unsigned_long>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                         *)cmds,&complete_command);
    __it._M_cur = (__node_type *)
                  pVar15.first.
                  super__Node_iterator_base<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>,_true>
                  ._M_cur;
    std::
    vector<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~vector((vector<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *)&complete_command.field_2);
    std::
    vector<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~vector((vector<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *)(local_90 + 8));
    std::
    vector<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::resize((vector<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)((long)__it._M_cur + 0x20),(ulong)msg->num_parts);
  }
  __p._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       payload._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  *(undefined8 *)
   ((long)&((__it._M_cur)->
           super__Hash_node_value<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>_>
           ._M_storage._M_storage + 0x10) = uVar6;
  lVar10 = *(long *)((long)&((__it._M_cur)->
                            super__Hash_node_value<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>,_true>
                            ).
                            super__Hash_node_value_base<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>_>
                            ._M_storage._M_storage + 0x18);
  if (*(long *)((long)&((__it._M_cur)->
                       super__Hash_node_value<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>,_true>
                       ).
                       super__Hash_node_value_base<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>_>
                       ._M_storage._M_storage + 0x20) - lVar10 >> 3 != (ulong)msg->num_parts) {
    this_02 = (number_of_parts_mismatch *)__cxa_allocate_exception(0x10);
    number_of_parts_mismatch::number_of_parts_mismatch(this_02);
    __cxa_throw(this_02,&number_of_parts_mismatch::typeinfo,std::runtime_error::~runtime_error);
  }
  this_00 = (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(lVar10 + (ulong)msg->part_no * 8);
  pbVar1 = (this_00->_M_t).
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
  payload._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reset(this_00,(pointer)__p._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl);
  if (pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
LAB_0011a8d5:
    *(undefined8 *)this = 0;
    goto LAB_0011a8da;
  }
  plVar12 = *(long **)((long)&((__it._M_cur)->
                              super__Hash_node_value<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>,_true>
                              ).
                              super__Hash_node_value_base<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>_>
                              ._M_storage._M_storage + 0x18);
  plVar2 = *(long **)((long)&((__it._M_cur)->
                             super__Hash_node_value<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>,_true>
                             ).
                             super__Hash_node_value_base<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>_>
                             ._M_storage._M_storage + 0x20);
  lVar10 = (long)plVar2 - (long)plVar12;
  plVar7 = plVar12;
  for (lVar11 = lVar10 >> 5; 0 < lVar11; lVar11 = lVar11 + -1) {
    if (*plVar7 == 0) goto LAB_0011a8d0;
    if (plVar7[1] == 0) {
      plVar7 = plVar7 + 1;
      goto LAB_0011a8d0;
    }
    if (plVar7[2] == 0) {
      plVar7 = plVar7 + 2;
      goto LAB_0011a8d0;
    }
    if (plVar7[3] == 0) {
      plVar7 = plVar7 + 3;
      goto LAB_0011a8d0;
    }
    plVar7 = plVar7 + 4;
    lVar10 = lVar10 + -0x20;
  }
  lVar10 = lVar10 >> 3;
  if (lVar10 == 1) {
LAB_0011a8b6:
    if (*plVar7 != 0) {
      plVar7 = plVar2;
    }
LAB_0011a8d0:
    if (plVar7 != plVar2) goto LAB_0011a8d5;
  }
  else {
    if (lVar10 == 2) {
LAB_0011a8ac:
      if (*plVar7 != 0) {
        plVar7 = plVar7 + 1;
        goto LAB_0011a8b6;
      }
      goto LAB_0011a8d0;
    }
    if (lVar10 == 3) {
      if (*plVar7 != 0) {
        plVar7 = plVar7 + 1;
        goto LAB_0011a8ac;
      }
      goto LAB_0011a8d0;
    }
  }
  complete_command._M_dataplus._M_p = (pointer)&complete_command.field_2;
  complete_command._M_string_length = 0;
  complete_command.field_2._M_allocated_capacity =
       complete_command.field_2._M_allocated_capacity & 0xffffffffffffff00;
  for (; plVar12 != plVar2; plVar12 = plVar12 + 1) {
    if (*plVar12 == 0) {
      assert_failed("c.get () != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/broker/parser.cpp"
                    ,0x67);
    }
    std::__cxx11::string::append((string *)&complete_command);
  }
  std::
  _Hashtable<std::pair<unsigned_long,_unsigned_long>,_std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_long,_unsigned_long>_>,_std::hash<std::pair<unsigned_long,_unsigned_long>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::erase(&cmds->_M_h,(const_iterator)__it._M_cur);
  last._M_current = complete_command._M_dataplus._M_p + complete_command._M_string_length;
  iVar9._M_current = last._M_current;
  iVar8 = anon_unknown.dwarf_b6e21::skip_ws((iterator)complete_command._M_dataplus._M_p,last);
  lVar10 = (long)last._M_current - (long)iVar8._M_current;
  this_03 = iVar8;
  for (lVar11 = lVar10 >> 2; 0 < lVar11; lVar11 = lVar11 + -1) {
    bVar5 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::$_1>::operator()
                      ((_Iter_pred<(anonymous_namespace)::__1> *)this_03._M_current,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )iVar9._M_current);
    verb_parts.second._M_current = this_03._M_current;
    if (bVar5) goto LAB_0011aa0b;
    bVar5 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::$_1>::operator()
                      ((_Iter_pred<(anonymous_namespace)::__1> *)this_03._M_current + 1,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )iVar9._M_current);
    verb_parts.second._M_current =
         (char *)((_Iter_pred<(anonymous_namespace)::__1> *)this_03._M_current + 1);
    if (bVar5) goto LAB_0011aa0b;
    bVar5 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::$_1>::operator()
                      ((_Iter_pred<(anonymous_namespace)::__1> *)this_03._M_current + 2,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )iVar9._M_current);
    verb_parts.second._M_current =
         (char *)((_Iter_pred<(anonymous_namespace)::__1> *)this_03._M_current + 2);
    if (bVar5) goto LAB_0011aa0b;
    bVar5 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::$_1>::operator()
                      ((_Iter_pred<(anonymous_namespace)::__1> *)this_03._M_current + 3,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )iVar9._M_current);
    verb_parts.second._M_current =
         (char *)((_Iter_pred<(anonymous_namespace)::__1> *)this_03._M_current + 3);
    if (bVar5) goto LAB_0011aa0b;
    this_03._M_current = this_03._M_current + 4;
    lVar10 = lVar10 + -4;
  }
  if (lVar10 == 1) {
LAB_0011aa89:
    bVar5 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::$_1>::operator()
                      ((_Iter_pred<(anonymous_namespace)::__1> *)this_03._M_current,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )iVar9._M_current);
    verb_parts.second._M_current = this_03._M_current;
    if (!bVar5) {
      verb_parts.second._M_current = last._M_current;
    }
  }
  else if (lVar10 == 2) {
LAB_0011a9ec:
    bVar5 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::$_1>::operator()
                      ((_Iter_pred<(anonymous_namespace)::__1> *)this_03._M_current,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )iVar9._M_current);
    verb_parts.second._M_current = this_03._M_current;
    if (!bVar5) {
      this_03._M_current = this_03._M_current + 1;
      goto LAB_0011aa89;
    }
  }
  else {
    verb_parts.second._M_current = last._M_current;
    if ((lVar10 == 3) &&
       (bVar5 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::$_1>::operator()
                          ((_Iter_pred<(anonymous_namespace)::__1> *)this_03._M_current,
                           (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )iVar9._M_current), verb_parts.second._M_current = this_03._M_current,
       !bVar5)) {
      this_03._M_current = this_03._M_current + 1;
      goto LAB_0011a9ec;
    }
  }
LAB_0011aa0b:
  verb_parts.first._M_current = iVar8._M_current;
  iVar9 = anon_unknown.dwarf_b6e21::skip_ws(verb_parts.second._M_current,last);
  anon_unknown.dwarf_b6e21::substr((string *)local_90,&verb_parts);
  local_50.first._M_current = iVar9._M_current;
  local_50.second._M_current = last._M_current;
  anon_unknown.dwarf_b6e21::substr(&local_70,&local_50);
  std::make_unique<pstore::broker::broker_command,std::__cxx11::string,std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)&complete_command);
LAB_0011a8da:
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&payload);
  return (__uniq_ptr_data<pstore::broker::broker_command,_std::default_delete<pstore::broker::broker_command>,_true,_true>
          )(__uniq_ptr_data<pstore::broker::broker_command,_std::default_delete<pstore::broker::broker_command>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<broker_command> parse (brokerface::message_type const & msg,
                                               partial_cmds & cmds) {

            if (msg.part_no >= msg.num_parts) {
                throw part_number_too_large ();
            }

            auto const now = std::chrono::system_clock::now ();

            auto payload = extract_payload (msg);

            auto const key = std::make_pair (msg.sender_id, msg.message_id);
            auto it = cmds.find (key);
            if (it == std::end (cmds)) {
                it = cmds.insert (std::make_pair (key, pieces{})).first;
                it->second.s_.resize (msg.num_parts);
            }

            // Record the arrival time of this newest message of the set.
            it->second.arrive_time_ = now;
            auto & value = it->second.s_;
            if (value.size () != msg.num_parts) {
                throw number_of_parts_mismatch ();
            }

            bool const was_missing = value[msg.part_no].get () == nullptr;
            value[msg.part_no] = std::move (payload);

            if (was_missing) {
                auto not_null = [] (std::unique_ptr<std::string> const & str) {
                    return str != nullptr;
                };
                if (std::all_of (std::begin (value), std::end (value), not_null)) {
                    std::string complete_command;
                    for (auto const & c : value) {
                        PSTORE_ASSERT (c.get () != nullptr);
                        complete_command += *c;
                    }

                    cmds.erase (it);

                    auto end = std::end (complete_command);
                    auto const verb_parts = extract_word (std::begin (complete_command), end);
                    auto const path_parts = std::make_pair (skip_ws (verb_parts.second, end), end);
                    return std::make_unique<broker_command> (substr (verb_parts),
                                                             substr (path_parts));
                }
            }

            return nullptr;
        }